

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmci.c
# Opt level: O0

void Cnf_DataLiftGia(Cnf_Dat_t *p,Gia_Man_t *pGia,int nVarsPlus)

{
  int *piVar1;
  int iVar2;
  bool bVar3;
  int local_2c;
  Gia_Obj_t *pGStack_28;
  int v;
  Gia_Obj_t *pObj;
  int nVarsPlus_local;
  Gia_Man_t *pGia_local;
  Cnf_Dat_t *p_local;
  
  local_2c = 0;
  while( true ) {
    bVar3 = false;
    if (local_2c < pGia->nObjs) {
      pGStack_28 = Gia_ManObj(pGia,local_2c);
      bVar3 = pGStack_28 != (Gia_Obj_t *)0x0;
    }
    if (!bVar3) break;
    piVar1 = p->pVarNums;
    iVar2 = Gia_ObjId(pGia,pGStack_28);
    if (-1 < piVar1[iVar2]) {
      piVar1 = p->pVarNums;
      iVar2 = Gia_ObjId(pGia,pGStack_28);
      piVar1[iVar2] = nVarsPlus + piVar1[iVar2];
    }
    local_2c = local_2c + 1;
  }
  for (local_2c = 0; local_2c < p->nLiterals; local_2c = local_2c + 1) {
    (*p->pClauses)[local_2c] = nVarsPlus * 2 + (*p->pClauses)[local_2c];
  }
  return;
}

Assistant:

static inline void Cnf_DataLiftGia( Cnf_Dat_t * p, Gia_Man_t * pGia, int nVarsPlus )
{
    Gia_Obj_t * pObj;
    int v;
    Gia_ManForEachObj( pGia, pObj, v )
        if ( p->pVarNums[Gia_ObjId(pGia, pObj)] >= 0 )
            p->pVarNums[Gia_ObjId(pGia, pObj)] += nVarsPlus;
    for ( v = 0; v < p->nLiterals; v++ )
        p->pClauses[0][v] += 2*nVarsPlus;
}